

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl&>&>&,kj::None_const&>&,char_const(&)[65]>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<kj::Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_&>_&,_const_kj::None_&>
          *params,char (*params_1) [65])

{
  undefined4 in_register_00000014;
  char (*params_00) [65];
  ArrayDisposer **local_d0;
  undefined1 local_68 [8];
  String argValues [2];
  char *macroArgs_local;
  char *condition_local;
  Type code_local;
  int line_local;
  char *file_local;
  Fault *this_local;
  
  this->exception = (Exception *)0x0;
  str<kj::_::DebugComparison<kj::Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl&>&>&,kj::None_const&>&>
            ((String *)local_68,(kj *)params,
             (DebugComparison<kj::Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_&>_&,_const_kj::None_&>
              *)CONCAT44(in_register_00000014,line));
  str<char_const(&)[65]>((String *)&argValues[0].content.disposer,(kj *)params_1,params_00);
  arrayPtr<kj::String>((String *)local_68,2);
  init(this,(EVP_PKEY_CTX *)file);
  local_d0 = &argValues[1].content.disposer;
  do {
    local_d0 = local_d0 + -3;
    String::~String((String *)local_d0);
  } while (local_d0 != (ArrayDisposer **)local_68);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}